

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check_data.h
# Opt level: O0

void __thiscall
mp::SolCheck::SolCheck
          (SolCheck *this,ArrayRef<double> *x,ValueMapDbl *param_3,ArrayRef<double> *obj,
          ArrayRef<double> *x_raw,ArrayRef<mp::var::Type> *vtype,ArrayRef<double> *lb,
          ArrayRef<double> *ub,double feastol,double feastolrel,int sol_rnd,int sol_prec,
          bool recomp_vals,int chk_mode)

{
  array<mp::ViolSummary,_2UL> *in_RCX;
  long in_RDI;
  ArrayRef<mp::var::Type> *in_R8;
  ArrayRef<mp::var::Type> *in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined4 in_stack_00000018;
  byte in_stack_00000028;
  undefined4 in_stack_00000030;
  ArrayRef<double> *in_stack_fffffffffffffe68;
  ArrayRef<double> *other;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  ArrayRef<double> *in_stack_fffffffffffffea8;
  ArrayRef<double> *lb_00;
  ArrayRef<mp::var::Type> *type;
  ArrayRef<double> *x_raw_00;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffef7;
  pointer in_stack_fffffffffffffef8;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *in_stack_ffffffffffffff00;
  ArrayRef<double> *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  ArrayRef<mp::var::Type> local_b8;
  ArrayRef<double> local_90;
  byte local_49;
  undefined8 local_48;
  undefined8 local_40;
  
  local_49 = in_stack_00000028 & 1;
  local_48 = in_XMM1_Qa;
  local_40 = in_XMM0_Qa;
  mp::ArrayRef::operator_cast_to_vector(in_stack_fffffffffffffea8);
  lb_00 = &local_90;
  ArrayRef<double>::ArrayRef
            ((ArrayRef<double> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             in_stack_fffffffffffffe68);
  type = &local_b8;
  ArrayRef<mp::var::Type>::ArrayRef(in_R9,in_R8);
  x_raw_00 = (ArrayRef<double> *)&stack0xffffffffffffff20;
  ArrayRef<double>::ArrayRef
            ((ArrayRef<double> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             in_stack_fffffffffffffe68);
  other = (ArrayRef<double> *)&stack0xfffffffffffffef8;
  ArrayRef<double>::ArrayRef
            ((ArrayRef<double> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             in_stack_fffffffffffffe68);
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::VarInfoImpl
            (in_stack_ffffffffffffff00,(double)in_stack_fffffffffffffef8,
             (bool)in_stack_fffffffffffffef7,in_stack_fffffffffffffee8,x_raw_00,type,lb_00,
             in_stack_ffffffffffffff10,in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
  ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x16fcab);
  ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x16fcb8);
  ArrayRef<mp::var::Type>::~ArrayRef((ArrayRef<mp::var::Type> *)0x16fcc5);
  ArrayRef<double>::~ArrayRef((ArrayRef<double> *)0x16fcd2);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_RCX);
  ArrayRef<double>::ArrayRef
            ((ArrayRef<double> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_00000018),other);
  *(undefined8 *)(in_RDI + 0xf8) = local_40;
  *(undefined8 *)(in_RDI + 0x100) = local_48;
  *(byte *)(in_RDI + 0x108) = local_49 & 1;
  *(undefined4 *)(in_RDI + 0x10c) = in_stack_00000030;
  std::__cxx11::string::string((string *)(in_RDI + 0x110));
  std::array<mp::ViolSummary,_2UL>::array(in_RCX);
  std::array<mp::ViolSummary,_2UL>::array(in_RCX);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
         *)0x16fd77);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::array<mp::ViolSummary,_3UL>_>_>_>
         *)0x16fd88);
  ViolSummary::ViolSummary((ViolSummary *)(in_RDI + 0x230));
  return;
}

Assistant:

SolCheck(ArrayRef<double> x,
           const pre::ValueMapDbl& , //duals,
           ArrayRef<double> obj,
           ArrayRef<double> x_raw,
           ArrayRef<var::Type> vtype,
           ArrayRef<double> lb,  ArrayRef<double> ub,
           double feastol, double feastolrel,
           int sol_rnd, int sol_prec,
           bool recomp_vals, int chk_mode)
      : x_(feastol, recomp_vals,
           x, x_raw, vtype, lb, ub, sol_rnd, sol_prec),
      obj_(obj),
      feastol_(feastol), feastolrel_(feastolrel),
      fRecomputedVals_(recomp_vals),
      check_mode_(chk_mode) { }